

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Ref<embree::Geometry> *pRVar8;
  Geometry *pGVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  byte bVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  AABBNodeMB4D *node1;
  ulong uVar74;
  long lVar75;
  uint uVar76;
  int iVar77;
  ulong uVar78;
  long lVar79;
  ulong *puVar80;
  ulong uVar81;
  long lVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  Scene *pSVar89;
  long lVar90;
  ulong uVar91;
  ulong uVar92;
  ulong uVar93;
  ulong uVar94;
  ulong uVar95;
  RTCIntersectArguments *pRVar96;
  ulong uVar97;
  ulong uVar98;
  undefined1 auVar100 [16];
  float fVar99;
  float fVar106;
  undefined1 auVar101 [16];
  float fVar104;
  float fVar105;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar110;
  float fVar111;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar113 [32];
  float fVar117;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar112 [16];
  float fVar118;
  undefined1 auVar116 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar127;
  float fVar131;
  undefined1 auVar125 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar140;
  undefined1 auVar139 [64];
  undefined1 auVar144 [16];
  float fVar141;
  float fVar148;
  float fVar149;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar150;
  undefined1 auVar147 [32];
  float fVar154;
  float fVar155;
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar167;
  float fVar169;
  float fVar171;
  undefined1 auVar158 [32];
  float fVar160;
  float fVar162;
  float fVar166;
  float fVar168;
  float fVar170;
  undefined1 auVar159 [64];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  float fVar175;
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  float fVar183;
  float fVar187;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar181;
  float fVar182;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar180 [64];
  float fVar189;
  undefined1 auVar188 [64];
  float fVar190;
  undefined1 auVar191 [32];
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  undefined1 auVar192 [64];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  float fVar207;
  undefined1 auVar208 [32];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar209 [64];
  float fVar216;
  float fVar217;
  undefined1 auVar218 [32];
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  undefined1 auVar219 [64];
  float fVar232;
  float fVar234;
  undefined1 auVar233 [64];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [64];
  float fVar238;
  float fVar239;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar240 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_1894;
  Scene *local_1890;
  RayQueryContext *local_1888;
  undefined8 local_1880;
  float fStack_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  float fStack_1868;
  float fStack_1864;
  undefined8 local_1860;
  float fStack_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  float fStack_1848;
  float fStack_1844;
  undefined1 local_1830 [8];
  float fStack_1828;
  float fStack_1824;
  undefined1 local_1820 [8];
  float fStack_1818;
  float fStack_1814;
  long local_1808;
  ulong local_1800;
  ulong local_17f8;
  long local_17f0;
  ulong local_17e8;
  uint local_17e0;
  uint local_17dc;
  float local_17d8;
  undefined4 local_17d4;
  undefined4 local_17d0;
  undefined4 local_17cc;
  uint local_17c8;
  uint local_17c4;
  uint local_17c0;
  RTCFilterFunctionNArguments local_17b0;
  undefined1 local_1780 [32];
  undefined1 local_1760 [32];
  undefined1 local_1740 [32];
  undefined1 local_1720 [32];
  undefined1 local_1700 [8];
  float fStack_16f8;
  float fStack_16f4;
  undefined1 local_16e0 [8];
  float fStack_16d8;
  float fStack_16d4;
  undefined1 local_16c0 [8];
  float fStack_16b8;
  float fStack_16b4;
  undefined1 local_16a0 [32];
  undefined1 local_1680 [8];
  float fStack_1678;
  float fStack_1674;
  undefined1 local_1660 [8];
  float fStack_1658;
  float fStack_1654;
  undefined4 uStack_1644;
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [8];
  float fStack_1498;
  float fStack_1494;
  undefined1 local_1490 [8];
  float fStack_1488;
  float fStack_1484;
  undefined1 local_1480 [8];
  float fStack_1478;
  float fStack_1474;
  undefined1 local_1470 [8];
  float fStack_1468;
  float fStack_1464;
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [32];
  ulong local_1200 [570];
  undefined1 auVar126 [64];
  
  local_1200[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200[0] != 8) {
    fVar141 = ray->tfar;
    if (0.0 <= fVar141) {
      local_1888 = context;
      puVar80 = local_1200 + 1;
      aVar5 = (ray->dir).field_0;
      auVar100 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar101._8_4_ = 0x7fffffff;
      auVar101._0_8_ = 0x7fffffff7fffffff;
      auVar101._12_4_ = 0x7fffffff;
      auVar101 = vandps_avx((undefined1  [16])aVar5,auVar101);
      auVar112._8_4_ = 0x219392ef;
      auVar112._0_8_ = 0x219392ef219392ef;
      auVar112._12_4_ = 0x219392ef;
      auVar101 = vcmpps_avx(auVar101,auVar112,1);
      auVar142._8_4_ = 0x3f800000;
      auVar142._0_8_ = 0x3f8000003f800000;
      auVar142._12_4_ = 0x3f800000;
      auVar112 = vdivps_avx(auVar142,(undefined1  [16])aVar5);
      auVar143._8_4_ = 0x5d5e0b6b;
      auVar143._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar143._12_4_ = 0x5d5e0b6b;
      auVar101 = vblendvps_avx(auVar112,auVar143,auVar101);
      auVar132._0_4_ = auVar101._0_4_ * 0.99999964;
      auVar132._4_4_ = auVar101._4_4_ * 0.99999964;
      auVar132._8_4_ = auVar101._8_4_ * 0.99999964;
      auVar132._12_4_ = auVar101._12_4_ * 0.99999964;
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      local_14c0._4_4_ = uVar3;
      local_14c0._0_4_ = uVar3;
      local_14c0._8_4_ = uVar3;
      local_14c0._12_4_ = uVar3;
      local_14c0._16_4_ = uVar3;
      local_14c0._20_4_ = uVar3;
      local_14c0._24_4_ = uVar3;
      local_14c0._28_4_ = uVar3;
      auVar180 = ZEXT3264(local_14c0);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_14e0._4_4_ = uVar3;
      local_14e0._0_4_ = uVar3;
      local_14e0._8_4_ = uVar3;
      local_14e0._12_4_ = uVar3;
      local_14e0._16_4_ = uVar3;
      local_14e0._20_4_ = uVar3;
      local_14e0._24_4_ = uVar3;
      local_14e0._28_4_ = uVar3;
      auVar188 = ZEXT3264(local_14e0);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1500._4_4_ = uVar3;
      local_1500._0_4_ = uVar3;
      local_1500._8_4_ = uVar3;
      local_1500._12_4_ = uVar3;
      local_1500._16_4_ = uVar3;
      local_1500._20_4_ = uVar3;
      local_1500._24_4_ = uVar3;
      local_1500._28_4_ = uVar3;
      auVar192 = ZEXT3264(local_1500);
      auVar119._0_4_ = auVar101._0_4_ * 1.0000004;
      auVar119._4_4_ = auVar101._4_4_ * 1.0000004;
      auVar119._8_4_ = auVar101._8_4_ * 1.0000004;
      auVar119._12_4_ = auVar101._12_4_ * 1.0000004;
      auVar101 = vshufps_avx(auVar132,auVar132,0);
      local_1520._16_16_ = auVar101;
      local_1520._0_16_ = auVar101;
      auVar206 = ZEXT3264(local_1520);
      auVar101 = vmovshdup_avx(auVar132);
      auVar112 = vshufps_avx(auVar132,auVar132,0x55);
      local_1540._16_16_ = auVar112;
      local_1540._0_16_ = auVar112;
      auVar209 = ZEXT3264(local_1540);
      auVar112 = vshufpd_avx(auVar132,auVar132,1);
      auVar142 = vshufps_avx(auVar132,auVar132,0xaa);
      local_1560._16_16_ = auVar142;
      local_1560._0_16_ = auVar142;
      auVar219 = ZEXT3264(local_1560);
      auVar142 = vshufps_avx(auVar119,auVar119,0);
      local_1580._16_16_ = auVar142;
      local_1580._0_16_ = auVar142;
      auVar233 = ZEXT3264(local_1580);
      auVar142 = vshufps_avx(auVar119,auVar119,0x55);
      auVar139 = ZEXT1664(auVar142);
      local_15a0._16_16_ = auVar142;
      local_15a0._0_16_ = auVar142;
      auVar237 = ZEXT3264(local_15a0);
      auVar142 = vshufps_avx(auVar119,auVar119,0xaa);
      local_15c0._16_16_ = auVar142;
      local_15c0._0_16_ = auVar142;
      auVar240 = ZEXT3264(local_15c0);
      uVar92 = (ulong)(auVar132._0_4_ < 0.0) * 0x20;
      uVar97 = (ulong)(auVar101._0_4_ < 0.0) << 5 | 0x40;
      uVar98 = (ulong)(auVar112._0_4_ < 0.0) << 5 | 0x80;
      auVar101 = vshufps_avx(auVar100,auVar100,0);
      local_15e0._16_16_ = auVar101;
      local_15e0._0_16_ = auVar101;
      auVar159 = ZEXT3264(local_15e0);
      auVar101 = vshufps_avx(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),0);
      local_1420._16_16_ = auVar101;
      local_1420._0_16_ = auVar101;
      local_1440._16_16_ = mm_lookupmask_ps._240_16_;
      local_1440._0_16_ = mm_lookupmask_ps._0_16_;
      auVar116 = ZEXT3264(local_1440);
      auVar121._8_4_ = 0x3f800000;
      auVar121._0_8_ = 0x3f8000003f800000;
      auVar121._12_4_ = 0x3f800000;
      auVar121._16_4_ = 0x3f800000;
      auVar121._20_4_ = 0x3f800000;
      auVar121._24_4_ = 0x3f800000;
      auVar121._28_4_ = 0x3f800000;
      auVar126 = ZEXT3264(auVar121);
      auVar102._8_4_ = 0xbf800000;
      auVar102._0_8_ = 0xbf800000bf800000;
      auVar102._12_4_ = 0xbf800000;
      auVar102._16_4_ = 0xbf800000;
      auVar102._20_4_ = 0xbf800000;
      auVar102._24_4_ = 0xbf800000;
      auVar102._28_4_ = 0xbf800000;
      local_1460 = vblendvps_avx(auVar121,auVar102,local_1440);
LAB_00e709b4:
      if (puVar80 != local_1200) {
        uVar81 = puVar80[-1];
        puVar80 = puVar80 + -1;
        do {
          fVar141 = (ray->dir).field_0.m128[3];
          auVar103._4_4_ = fVar141;
          auVar103._0_4_ = fVar141;
          auVar103._8_4_ = fVar141;
          auVar103._12_4_ = fVar141;
          auVar103._16_4_ = fVar141;
          auVar103._20_4_ = fVar141;
          auVar103._24_4_ = fVar141;
          auVar103._28_4_ = fVar141;
          do {
            if ((uVar81 & 8) != 0) {
              local_1808 = (ulong)((uint)uVar81 & 0xf) - 8;
              uVar81 = uVar81 & 0xfffffffffffffff0;
              lVar82 = 0;
              goto LAB_00e70b65;
            }
            uVar74 = uVar81 & 0xfffffffffffffff0;
            pfVar2 = (float *)(uVar74 + 0x100 + uVar92);
            pfVar1 = (float *)(uVar74 + 0x40 + uVar92);
            auVar113._0_4_ = fVar141 * *pfVar2 + *pfVar1;
            auVar113._4_4_ = fVar141 * pfVar2[1] + pfVar1[1];
            auVar113._8_4_ = fVar141 * pfVar2[2] + pfVar1[2];
            auVar113._12_4_ = fVar141 * pfVar2[3] + pfVar1[3];
            auVar113._16_4_ = fVar141 * pfVar2[4] + pfVar1[4];
            auVar113._20_4_ = fVar141 * pfVar2[5] + pfVar1[5];
            auVar113._24_4_ = fVar141 * pfVar2[6] + pfVar1[6];
            auVar113._28_4_ = auVar116._28_4_ + pfVar1[7];
            auVar102 = vsubps_avx(auVar113,auVar180._0_32_);
            auVar33._4_4_ = auVar206._4_4_ * auVar102._4_4_;
            auVar33._0_4_ = auVar206._0_4_ * auVar102._0_4_;
            auVar33._8_4_ = auVar206._8_4_ * auVar102._8_4_;
            auVar33._12_4_ = auVar206._12_4_ * auVar102._12_4_;
            auVar33._16_4_ = auVar206._16_4_ * auVar102._16_4_;
            auVar33._20_4_ = auVar206._20_4_ * auVar102._20_4_;
            auVar33._24_4_ = auVar206._24_4_ * auVar102._24_4_;
            auVar33._28_4_ = auVar102._28_4_;
            auVar102 = vmaxps_avx(auVar159._0_32_,auVar33);
            pfVar2 = (float *)(uVar74 + 0x100 + uVar97);
            pfVar1 = (float *)(uVar74 + 0x40 + uVar97);
            auVar122._0_4_ = fVar141 * *pfVar2 + *pfVar1;
            auVar122._4_4_ = fVar141 * pfVar2[1] + pfVar1[1];
            auVar122._8_4_ = fVar141 * pfVar2[2] + pfVar1[2];
            auVar122._12_4_ = fVar141 * pfVar2[3] + pfVar1[3];
            auVar122._16_4_ = fVar141 * pfVar2[4] + pfVar1[4];
            auVar122._20_4_ = fVar141 * pfVar2[5] + pfVar1[5];
            auVar122._24_4_ = fVar141 * pfVar2[6] + pfVar1[6];
            auVar122._28_4_ = auVar126._28_4_ + pfVar1[7];
            auVar121 = vsubps_avx(auVar122,auVar188._0_32_);
            auVar34._4_4_ = auVar209._4_4_ * auVar121._4_4_;
            auVar34._0_4_ = auVar209._0_4_ * auVar121._0_4_;
            auVar34._8_4_ = auVar209._8_4_ * auVar121._8_4_;
            auVar34._12_4_ = auVar209._12_4_ * auVar121._12_4_;
            auVar34._16_4_ = auVar209._16_4_ * auVar121._16_4_;
            auVar34._20_4_ = auVar209._20_4_ * auVar121._20_4_;
            auVar34._24_4_ = auVar209._24_4_ * auVar121._24_4_;
            auVar34._28_4_ = auVar121._28_4_;
            pfVar2 = (float *)(uVar74 + 0x100 + uVar98);
            pfVar1 = (float *)(uVar74 + 0x40 + uVar98);
            auVar133._0_4_ = fVar141 * *pfVar2 + *pfVar1;
            auVar133._4_4_ = fVar141 * pfVar2[1] + pfVar1[1];
            auVar133._8_4_ = fVar141 * pfVar2[2] + pfVar1[2];
            auVar133._12_4_ = fVar141 * pfVar2[3] + pfVar1[3];
            auVar133._16_4_ = fVar141 * pfVar2[4] + pfVar1[4];
            auVar133._20_4_ = fVar141 * pfVar2[5] + pfVar1[5];
            auVar133._24_4_ = fVar141 * pfVar2[6] + pfVar1[6];
            auVar133._28_4_ = auVar139._28_4_ + pfVar1[7];
            auVar115 = vsubps_avx(auVar133,auVar192._0_32_);
            auVar35._4_4_ = auVar219._4_4_ * auVar115._4_4_;
            auVar35._0_4_ = auVar219._0_4_ * auVar115._0_4_;
            auVar35._8_4_ = auVar219._8_4_ * auVar115._8_4_;
            auVar35._12_4_ = auVar219._12_4_ * auVar115._12_4_;
            auVar35._16_4_ = auVar219._16_4_ * auVar115._16_4_;
            auVar35._20_4_ = auVar219._20_4_ * auVar115._20_4_;
            auVar35._24_4_ = auVar219._24_4_ * auVar115._24_4_;
            auVar35._28_4_ = auVar115._28_4_;
            auVar121 = vmaxps_avx(auVar34,auVar35);
            auVar102 = vmaxps_avx(auVar102,auVar121);
            pfVar2 = (float *)(uVar74 + 0x100 + (uVar92 ^ 0x20));
            pfVar1 = (float *)(uVar74 + 0x40 + (uVar92 ^ 0x20));
            auVar123._0_4_ = fVar141 * *pfVar2 + *pfVar1;
            auVar123._4_4_ = fVar141 * pfVar2[1] + pfVar1[1];
            auVar123._8_4_ = fVar141 * pfVar2[2] + pfVar1[2];
            auVar123._12_4_ = fVar141 * pfVar2[3] + pfVar1[3];
            auVar123._16_4_ = fVar141 * pfVar2[4] + pfVar1[4];
            auVar123._20_4_ = fVar141 * pfVar2[5] + pfVar1[5];
            auVar123._24_4_ = fVar141 * pfVar2[6] + pfVar1[6];
            auVar123._28_4_ = auVar121._28_4_ + pfVar1[7];
            auVar121 = vsubps_avx(auVar123,auVar180._0_32_);
            auVar36._4_4_ = auVar233._4_4_ * auVar121._4_4_;
            auVar36._0_4_ = auVar233._0_4_ * auVar121._0_4_;
            auVar36._8_4_ = auVar233._8_4_ * auVar121._8_4_;
            auVar36._12_4_ = auVar233._12_4_ * auVar121._12_4_;
            auVar36._16_4_ = auVar233._16_4_ * auVar121._16_4_;
            auVar36._20_4_ = auVar233._20_4_ * auVar121._20_4_;
            auVar36._24_4_ = auVar233._24_4_ * auVar121._24_4_;
            auVar36._28_4_ = auVar121._28_4_;
            pfVar2 = (float *)(uVar74 + 0x100 + (uVar97 ^ 0x20));
            auVar114 = vminps_avx(local_1420,auVar36);
            pfVar1 = (float *)(uVar74 + 0x40 + (uVar97 ^ 0x20));
            auVar134._0_4_ = fVar141 * *pfVar2 + *pfVar1;
            auVar134._4_4_ = fVar141 * pfVar2[1] + pfVar1[1];
            auVar134._8_4_ = fVar141 * pfVar2[2] + pfVar1[2];
            auVar134._12_4_ = fVar141 * pfVar2[3] + pfVar1[3];
            auVar134._16_4_ = fVar141 * pfVar2[4] + pfVar1[4];
            auVar134._20_4_ = fVar141 * pfVar2[5] + pfVar1[5];
            auVar134._24_4_ = fVar141 * pfVar2[6] + pfVar1[6];
            auVar134._28_4_ = auVar115._28_4_ + pfVar1[7];
            auVar121 = vsubps_avx(auVar134,auVar188._0_32_);
            pfVar2 = (float *)(uVar74 + 0x100 + (uVar98 ^ 0x20));
            pfVar1 = (float *)(uVar74 + 0x40 + (uVar98 ^ 0x20));
            auVar145._0_4_ = fVar141 * *pfVar2 + *pfVar1;
            auVar145._4_4_ = fVar141 * pfVar2[1] + pfVar1[1];
            auVar145._8_4_ = fVar141 * pfVar2[2] + pfVar1[2];
            auVar145._12_4_ = fVar141 * pfVar2[3] + pfVar1[3];
            auVar145._16_4_ = fVar141 * pfVar2[4] + pfVar1[4];
            auVar145._20_4_ = fVar141 * pfVar2[5] + pfVar1[5];
            auVar145._24_4_ = fVar141 * pfVar2[6] + pfVar1[6];
            auVar145._28_4_ = local_1420._28_4_ + pfVar1[7];
            auVar37._4_4_ = auVar237._4_4_ * auVar121._4_4_;
            auVar37._0_4_ = auVar237._0_4_ * auVar121._0_4_;
            auVar37._8_4_ = auVar237._8_4_ * auVar121._8_4_;
            auVar37._12_4_ = auVar237._12_4_ * auVar121._12_4_;
            auVar37._16_4_ = auVar237._16_4_ * auVar121._16_4_;
            auVar37._20_4_ = auVar237._20_4_ * auVar121._20_4_;
            auVar37._24_4_ = auVar237._24_4_ * auVar121._24_4_;
            auVar37._28_4_ = auVar121._28_4_;
            auVar121 = vsubps_avx(auVar145,auVar192._0_32_);
            auVar38._4_4_ = auVar240._4_4_ * auVar121._4_4_;
            auVar38._0_4_ = auVar240._0_4_ * auVar121._0_4_;
            auVar38._8_4_ = auVar240._8_4_ * auVar121._8_4_;
            auVar38._12_4_ = auVar240._12_4_ * auVar121._12_4_;
            auVar38._16_4_ = auVar240._16_4_ * auVar121._16_4_;
            auVar38._20_4_ = auVar240._20_4_ * auVar121._20_4_;
            auVar38._24_4_ = auVar240._24_4_ * auVar121._24_4_;
            auVar38._28_4_ = auVar121._28_4_;
            auVar121 = vminps_avx(auVar37,auVar38);
            auVar114 = vminps_avx(auVar114,auVar121);
            auVar102 = vcmpps_avx(auVar102,auVar114,2);
            if (((uint)uVar81 & 7) == 6) {
              auVar114 = vcmpps_avx(*(undefined1 (*) [32])(uVar74 + 0x1c0),auVar103,2);
              auVar121 = vcmpps_avx(auVar103,*(undefined1 (*) [32])(uVar74 + 0x1e0),1);
              auVar114 = vandps_avx(auVar114,auVar121);
              auVar102 = vandps_avx(auVar114,auVar102);
            }
            auVar139 = ZEXT3264(auVar121);
            auVar101 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
            auVar112 = vpsllw_avx(auVar101,0xf);
            auVar116 = ZEXT1664(auVar112);
            auVar101 = vpacksswb_avx(auVar112,auVar112);
            auVar126 = ZEXT1664(auVar101);
            bVar32 = SUB161(auVar101 >> 7,0) & 1 | (SUB161(auVar101 >> 0xf,0) & 1) << 1 |
                     (SUB161(auVar101 >> 0x17,0) & 1) << 2 | (SUB161(auVar101 >> 0x1f,0) & 1) << 3 |
                     (SUB161(auVar101 >> 0x27,0) & 1) << 4 | (SUB161(auVar101 >> 0x2f,0) & 1) << 5 |
                     (SUB161(auVar101 >> 0x37,0) & 1) << 6 | SUB161(auVar101 >> 0x3f,0) << 7;
            if ((((((((auVar112 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar112 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar112 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar112 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar112 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar112 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar112 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar112[0xf]) goto LAB_00e709b4;
            lVar82 = 0;
            if (bVar32 != 0) {
              for (; (bVar32 >> lVar82 & 1) == 0; lVar82 = lVar82 + 1) {
              }
            }
            uVar81 = *(ulong *)(uVar74 + lVar82 * 8);
            uVar76 = bVar32 - 1 & (uint)bVar32;
            uVar78 = (ulong)uVar76;
          } while (uVar76 == 0);
          do {
            *puVar80 = uVar81;
            puVar80 = puVar80 + 1;
            lVar82 = 0;
            if (uVar78 != 0) {
              for (; (uVar78 >> lVar82 & 1) == 0; lVar82 = lVar82 + 1) {
              }
            }
            uVar81 = *(ulong *)(uVar74 + lVar82 * 8);
            uVar78 = uVar78 - 1 & uVar78;
          } while (uVar78 != 0);
        } while( true );
      }
    }
  }
  return;
LAB_00e70b65:
  if (lVar82 == local_1808) goto LAB_00e709b4;
  lVar75 = lVar82 * 0x60;
  pSVar89 = local_1888->scene;
  local_1890 = pSVar89;
  pRVar8 = (pSVar89->geometries).items;
  pGVar9 = pRVar8[*(uint *)(uVar81 + 0x40 + lVar75)].ptr;
  fVar141 = (pGVar9->time_range).lower;
  fVar141 = pGVar9->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar141) / ((pGVar9->time_range).upper - fVar141));
  auVar101 = vroundss_avx(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),9);
  auVar101 = vminss_avx(auVar101,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar235 = vmaxss_avx(ZEXT816(0) << 0x20,auVar101);
  iVar77 = (int)auVar235._0_4_;
  lVar90 = (long)iVar77 * 0x38;
  lVar10 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar90);
  uVar93 = (ulong)*(uint *)(uVar81 + 4 + lVar75);
  auVar101 = *(undefined1 (*) [16])(lVar10 + (ulong)*(uint *)(uVar81 + lVar75) * 4);
  uVar83 = (ulong)*(uint *)(uVar81 + 0x10 + lVar75);
  auVar112 = *(undefined1 (*) [16])(lVar10 + uVar83 * 4);
  uVar84 = (ulong)*(uint *)(uVar81 + 0x20 + lVar75);
  auVar100 = *(undefined1 (*) [16])(lVar10 + uVar84 * 4);
  uVar85 = (ulong)*(uint *)(uVar81 + 0x30 + lVar75);
  auVar142 = *(undefined1 (*) [16])(lVar10 + uVar85 * 4);
  local_17f0 = *(long *)&pRVar8[*(uint *)(uVar81 + 0x44 + lVar75)].ptr[2].numPrimitives;
  lVar10 = *(long *)(local_17f0 + lVar90);
  auVar119 = *(undefined1 (*) [16])(lVar10 + uVar93 * 4);
  uVar86 = (ulong)*(uint *)(uVar81 + 0x14 + lVar75);
  auVar132 = *(undefined1 (*) [16])(lVar10 + uVar86 * 4);
  uVar87 = (ulong)*(uint *)(uVar81 + 0x24 + lVar75);
  auVar143 = *(undefined1 (*) [16])(lVar10 + uVar87 * 4);
  uVar88 = (ulong)*(uint *)(uVar81 + 0x34 + lVar75);
  auVar6 = *(undefined1 (*) [16])(lVar10 + uVar88 * 4);
  lVar10 = *(long *)&pRVar8[*(uint *)(uVar81 + 0x48 + lVar75)].ptr[2].numPrimitives;
  lVar11 = *(long *)(lVar10 + lVar90);
  uVar78 = (ulong)*(uint *)(uVar81 + 8 + lVar75);
  auVar144 = *(undefined1 (*) [16])(lVar11 + uVar78 * 4);
  local_17e8 = (ulong)*(uint *)(uVar81 + 0x18 + lVar75);
  auVar120 = *(undefined1 (*) [16])(lVar11 + local_17e8 * 4);
  uVar94 = CONCAT44(0,*(uint *)(uVar81 + 0x28 + lVar75));
  local_1720._0_8_ = uVar94;
  auVar156 = *(undefined1 (*) [16])(lVar11 + uVar94 * 4);
  uVar95 = (ulong)*(uint *)(uVar81 + 0x38 + lVar75);
  auVar176 = *(undefined1 (*) [16])(lVar11 + uVar95 * 4);
  fVar141 = fVar141 - auVar235._0_4_;
  lVar11 = *(long *)&pRVar8[*(uint *)(uVar81 + 0x4c + lVar75)].ptr[2].numPrimitives;
  lVar90 = *(long *)(lVar11 + lVar90);
  uVar74 = (ulong)*(uint *)(uVar81 + 0xc + lVar75);
  auVar235 = *(undefined1 (*) [16])(lVar90 + uVar74 * 4);
  local_1800 = (ulong)*(uint *)(uVar81 + 0x1c + lVar75);
  auVar7 = *(undefined1 (*) [16])(lVar90 + local_1800 * 4);
  auVar24 = vunpcklps_avx(auVar101,auVar144);
  auVar144 = vunpckhps_avx(auVar101,auVar144);
  auVar25 = vunpcklps_avx(auVar119,auVar235);
  auVar119 = vunpckhps_avx(auVar119,auVar235);
  uVar91 = (ulong)*(uint *)(uVar81 + 0x2c + lVar75);
  auVar101 = *(undefined1 (*) [16])(lVar90 + uVar91 * 4);
  auVar235 = vunpcklps_avx(auVar144,auVar119);
  _local_1470 = vunpcklps_avx(auVar24,auVar25);
  auVar73 = _local_1470;
  auVar119 = vunpckhps_avx(auVar24,auVar25);
  auVar24 = vunpcklps_avx(auVar112,auVar120);
  auVar144 = vunpckhps_avx(auVar112,auVar120);
  auVar120 = vunpcklps_avx(auVar132,auVar7);
  auVar132 = vunpckhps_avx(auVar132,auVar7);
  local_17f8 = (ulong)*(uint *)(uVar81 + 0x3c + lVar75);
  auVar112 = *(undefined1 (*) [16])(lVar90 + local_17f8 * 4);
  auVar144 = vunpcklps_avx(auVar144,auVar132);
  auVar7 = vunpcklps_avx(auVar24,auVar120);
  auVar132 = vunpckhps_avx(auVar24,auVar120);
  auVar120 = vunpcklps_avx(auVar100,auVar156);
  auVar100 = vunpckhps_avx(auVar100,auVar156);
  auVar156 = vunpcklps_avx(auVar143,auVar101);
  auVar143 = vunpckhps_avx(auVar143,auVar101);
  lVar79 = (long)(iVar77 + 1) * 0x38;
  lVar90 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar79);
  auVar101 = *(undefined1 (*) [16])(lVar90 + (ulong)*(uint *)(uVar81 + lVar75) * 4);
  _local_1820 = vunpcklps_avx(auVar100,auVar143);
  auVar69 = _local_1820;
  _local_14a0 = vunpcklps_avx(auVar120,auVar156);
  auVar70 = _local_14a0;
  _local_1490 = vunpckhps_avx(auVar120,auVar156);
  auVar71 = _local_1490;
  auVar143 = vunpcklps_avx(auVar142,auVar176);
  auVar100 = vunpckhps_avx(auVar142,auVar176);
  auVar120 = vunpcklps_avx(auVar6,auVar112);
  auVar142 = vunpckhps_avx(auVar6,auVar112);
  lVar10 = *(long *)(lVar10 + lVar79);
  auVar112 = *(undefined1 (*) [16])(lVar10 + uVar78 * 4);
  _local_1830 = vunpcklps_avx(auVar100,auVar142);
  auVar68 = _local_1830;
  auVar156 = vunpcklps_avx(auVar143,auVar120);
  _local_1480 = vunpckhps_avx(auVar143,auVar120);
  auVar72 = _local_1480;
  lVar12 = *(long *)(local_17f0 + lVar79);
  auVar142 = vunpcklps_avx(auVar101,auVar112);
  auVar100 = vunpckhps_avx(auVar101,auVar112);
  auVar101 = *(undefined1 (*) [16])(lVar12 + uVar93 * 4);
  lVar11 = *(long *)(lVar11 + lVar79);
  auVar112 = *(undefined1 (*) [16])(lVar11 + uVar74 * 4);
  auVar143 = vunpcklps_avx(auVar101,auVar112);
  auVar101 = vunpckhps_avx(auVar101,auVar112);
  auVar120 = vunpcklps_avx(auVar100,auVar101);
  auVar176 = vunpcklps_avx(auVar142,auVar143);
  auVar100 = vunpckhps_avx(auVar142,auVar143);
  auVar101 = *(undefined1 (*) [16])(lVar90 + uVar83 * 4);
  auVar112 = *(undefined1 (*) [16])(lVar10 + local_17e8 * 4);
  auVar143 = vunpcklps_avx(auVar101,auVar112);
  auVar142 = vunpckhps_avx(auVar101,auVar112);
  auVar101 = *(undefined1 (*) [16])(lVar12 + uVar86 * 4);
  auVar112 = *(undefined1 (*) [16])(lVar11 + local_1800 * 4);
  auVar6 = vunpcklps_avx(auVar101,auVar112);
  auVar101 = vunpckhps_avx(auVar101,auVar112);
  auVar24 = vunpcklps_avx(auVar142,auVar101);
  auVar25 = vunpcklps_avx(auVar143,auVar6);
  auVar142 = vunpckhps_avx(auVar143,auVar6);
  auVar101 = *(undefined1 (*) [16])(lVar90 + uVar84 * 4);
  auVar112 = *(undefined1 (*) [16])(lVar10 + uVar94 * 4);
  auVar6 = vunpcklps_avx(auVar101,auVar112);
  auVar143 = vunpckhps_avx(auVar101,auVar112);
  auVar101 = *(undefined1 (*) [16])(lVar12 + uVar87 * 4);
  auVar112 = *(undefined1 (*) [16])(lVar11 + uVar91 * 4);
  auVar26 = vunpcklps_avx(auVar101,auVar112);
  auVar101 = vunpckhps_avx(auVar101,auVar112);
  auVar27 = vunpcklps_avx(auVar143,auVar101);
  auVar28 = vunpcklps_avx(auVar6,auVar26);
  auVar143 = vunpckhps_avx(auVar6,auVar26);
  auVar101 = *(undefined1 (*) [16])(lVar90 + uVar85 * 4);
  auVar112 = *(undefined1 (*) [16])(lVar10 + uVar95 * 4);
  auVar26 = vunpcklps_avx(auVar101,auVar112);
  auVar6 = vunpckhps_avx(auVar101,auVar112);
  auVar101 = *(undefined1 (*) [16])(lVar12 + uVar88 * 4);
  auVar112 = *(undefined1 (*) [16])(lVar11 + local_17f8 * 4);
  auVar29 = vunpcklps_avx(auVar101,auVar112);
  auVar101 = vunpckhps_avx(auVar101,auVar112);
  auVar30 = vunpcklps_avx(auVar6,auVar101);
  auVar31 = vunpcklps_avx(auVar26,auVar29);
  auVar6 = vunpckhps_avx(auVar26,auVar29);
  auVar101 = vshufps_avx(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),0);
  auVar112 = vshufps_avx(ZEXT416((uint)(1.0 - fVar141)),ZEXT416((uint)(1.0 - fVar141)),0);
  fVar141 = auVar101._0_4_;
  fVar16 = auVar101._4_4_;
  fVar17 = auVar101._8_4_;
  fVar18 = auVar101._12_4_;
  fVar110 = auVar112._0_4_;
  fVar117 = auVar112._4_4_;
  fVar118 = auVar112._8_4_;
  fVar127 = auVar112._12_4_;
  auVar114._4_4_ = fVar117 * (float)local_1470._4_4_ + auVar176._4_4_ * fVar16;
  auVar114._0_4_ = fVar110 * (float)local_1470._0_4_ + auVar176._0_4_ * fVar141;
  auVar114._8_4_ = fVar118 * fStack_1468 + auVar176._8_4_ * fVar17;
  auVar114._12_4_ = fVar127 * fStack_1464 + auVar176._12_4_ * fVar18;
  local_16e0._0_4_ = auVar119._0_4_;
  local_16e0._4_4_ = auVar119._4_4_;
  fStack_16d8 = auVar119._8_4_;
  fStack_16d4 = auVar119._12_4_;
  auVar135._4_4_ = fVar117 * (float)local_16e0._4_4_ + fVar16 * auVar100._4_4_;
  auVar135._0_4_ = fVar110 * (float)local_16e0._0_4_ + fVar141 * auVar100._0_4_;
  auVar135._8_4_ = fVar118 * fStack_16d8 + fVar17 * auVar100._8_4_;
  auVar135._12_4_ = fVar127 * fStack_16d4 + fVar18 * auVar100._12_4_;
  local_1680._0_4_ = auVar235._0_4_;
  local_1680._4_4_ = auVar235._4_4_;
  fStack_1678 = auVar235._8_4_;
  fStack_1674 = auVar235._12_4_;
  auVar172._4_4_ = fVar117 * (float)local_1680._4_4_ + auVar120._4_4_ * fVar16;
  auVar172._0_4_ = fVar110 * (float)local_1680._0_4_ + auVar120._0_4_ * fVar141;
  auVar172._8_4_ = fVar118 * fStack_1678 + auVar120._8_4_ * fVar17;
  auVar172._12_4_ = fVar127 * fStack_1674 + auVar120._12_4_ * fVar18;
  local_1700._0_4_ = auVar7._0_4_;
  local_1700._4_4_ = auVar7._4_4_;
  fStack_16f8 = auVar7._8_4_;
  fStack_16f4 = auVar7._12_4_;
  auVar176._0_4_ = fVar110 * (float)local_1700._0_4_ + fVar141 * auVar25._0_4_;
  auVar176._4_4_ = fVar117 * (float)local_1700._4_4_ + fVar16 * auVar25._4_4_;
  auVar176._8_4_ = fVar118 * fStack_16f8 + fVar17 * auVar25._8_4_;
  auVar176._12_4_ = fVar127 * fStack_16f4 + fVar18 * auVar25._12_4_;
  local_16c0._0_4_ = auVar132._0_4_;
  local_16c0._4_4_ = auVar132._4_4_;
  fStack_16b8 = auVar132._8_4_;
  fStack_16b4 = auVar132._12_4_;
  auVar120._0_4_ = fVar110 * (float)local_16c0._0_4_ + auVar142._0_4_ * fVar141;
  auVar120._4_4_ = fVar117 * (float)local_16c0._4_4_ + auVar142._4_4_ * fVar16;
  auVar120._8_4_ = fVar118 * fStack_16b8 + auVar142._8_4_ * fVar17;
  auVar120._12_4_ = fVar127 * fStack_16b4 + auVar142._12_4_ * fVar18;
  local_1660._0_4_ = auVar144._0_4_;
  local_1660._4_4_ = auVar144._4_4_;
  fStack_1658 = auVar144._8_4_;
  fStack_1654 = auVar144._12_4_;
  auVar235._0_4_ = fVar110 * (float)local_1660._0_4_ + auVar24._0_4_ * fVar141;
  auVar235._4_4_ = fVar117 * (float)local_1660._4_4_ + auVar24._4_4_ * fVar16;
  auVar235._8_4_ = fVar118 * fStack_1658 + auVar24._8_4_ * fVar17;
  auVar235._12_4_ = fVar127 * fStack_1654 + auVar24._12_4_ * fVar18;
  auVar114._20_4_ = fVar117 * (float)local_14a0._4_4_ + fVar16 * auVar28._4_4_;
  auVar114._16_4_ = fVar110 * (float)local_14a0._0_4_ + fVar141 * auVar28._0_4_;
  auVar114._24_4_ = fVar118 * fStack_1498 + fVar17 * auVar28._8_4_;
  auVar114._28_4_ = fVar127 * fStack_1494 + fVar18 * auVar28._12_4_;
  auVar135._20_4_ = fVar117 * (float)local_1490._4_4_ + auVar143._4_4_ * fVar16;
  auVar135._16_4_ = fVar110 * (float)local_1490._0_4_ + auVar143._0_4_ * fVar141;
  auVar135._24_4_ = fVar118 * fStack_1488 + auVar143._8_4_ * fVar17;
  auVar135._28_4_ = fVar127 * fStack_1484 + auVar143._12_4_ * fVar18;
  auVar172._20_4_ = fVar117 * (float)local_1820._4_4_ + auVar27._4_4_ * fVar16;
  auVar172._16_4_ = fVar110 * (float)local_1820._0_4_ + auVar27._0_4_ * fVar141;
  auVar172._24_4_ = fVar118 * fStack_1818 + auVar27._8_4_ * fVar17;
  auVar172._28_4_ = fVar127 * fStack_1814 + auVar27._12_4_ * fVar18;
  lVar10 = uVar81 + 0x40 + lVar75;
  local_13e0 = *(undefined8 *)(lVar10 + 0x10);
  uStack_13d8 = *(undefined8 *)(lVar10 + 0x18);
  auVar144._0_4_ = auVar156._0_4_ * fVar110 + fVar141 * auVar31._0_4_;
  auVar144._4_4_ = auVar156._4_4_ * fVar117 + fVar16 * auVar31._4_4_;
  auVar144._8_4_ = auVar156._8_4_ * fVar118 + fVar17 * auVar31._8_4_;
  auVar144._12_4_ = auVar156._12_4_ * fVar127 + fVar18 * auVar31._12_4_;
  uStack_13d0 = local_13e0;
  uStack_13c8 = uStack_13d8;
  lVar75 = uVar81 + 0x50 + lVar75;
  local_1400 = *(undefined8 *)(lVar75 + 0x10);
  uStack_13f8 = *(undefined8 *)(lVar75 + 0x18);
  auVar156._0_4_ = fVar110 * (float)local_1480._0_4_ + fVar141 * auVar6._0_4_;
  auVar156._4_4_ = fVar117 * (float)local_1480._4_4_ + fVar16 * auVar6._4_4_;
  auVar156._8_4_ = fVar118 * fStack_1478 + fVar17 * auVar6._8_4_;
  auVar156._12_4_ = fVar127 * fStack_1474 + fVar18 * auVar6._12_4_;
  auVar100._0_4_ = fVar110 * (float)local_1830._0_4_ + fVar141 * auVar30._0_4_;
  auVar100._4_4_ = fVar117 * (float)local_1830._4_4_ + fVar16 * auVar30._4_4_;
  auVar100._8_4_ = fVar118 * fStack_1828 + fVar17 * auVar30._8_4_;
  auVar100._12_4_ = fVar127 * fStack_1824 + fVar18 * auVar30._12_4_;
  uStack_13f0 = local_1400;
  uStack_13e8 = uStack_13f8;
  auVar177._16_16_ = auVar176;
  auVar177._0_16_ = auVar176;
  auVar124._16_16_ = auVar120;
  auVar124._0_16_ = auVar120;
  auVar236._16_16_ = auVar235;
  auVar236._0_16_ = auVar235;
  auVar146._16_16_ = auVar144;
  auVar146._0_16_ = auVar144;
  auVar157._16_16_ = auVar156;
  auVar157._0_16_ = auVar156;
  auVar191._16_16_ = auVar100;
  auVar191._0_16_ = auVar100;
  uVar3 = *(undefined4 *)&(ray->org).field_0;
  auVar205._4_4_ = uVar3;
  auVar205._0_4_ = uVar3;
  auVar205._8_4_ = uVar3;
  auVar205._12_4_ = uVar3;
  auVar205._16_4_ = uVar3;
  auVar205._20_4_ = uVar3;
  auVar205._24_4_ = uVar3;
  auVar205._28_4_ = uVar3;
  uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar208._4_4_ = uVar4;
  auVar208._0_4_ = uVar4;
  auVar208._8_4_ = uVar4;
  auVar208._12_4_ = uVar4;
  auVar208._16_4_ = uVar4;
  auVar208._20_4_ = uVar4;
  auVar208._24_4_ = uVar4;
  auVar208._28_4_ = uVar4;
  uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar218._4_4_ = uVar4;
  auVar218._0_4_ = uVar4;
  auVar218._8_4_ = uVar4;
  auVar218._12_4_ = uVar4;
  auVar218._16_4_ = uVar4;
  auVar218._20_4_ = uVar4;
  auVar218._24_4_ = uVar4;
  auVar218._28_4_ = uVar4;
  local_1740 = vsubps_avx(auVar114,auVar205);
  local_1760 = vsubps_avx(auVar135,auVar208);
  local_1780 = vsubps_avx(auVar172,auVar218);
  auVar102 = vsubps_avx(auVar177,auVar205);
  auVar121 = vsubps_avx(auVar124,auVar208);
  auVar103 = vsubps_avx(auVar236,auVar218);
  auVar114 = vsubps_avx(auVar146,auVar205);
  auVar115 = vsubps_avx(auVar157,auVar208);
  auVar19 = vsubps_avx(auVar191,auVar218);
  local_1600 = vsubps_avx(auVar114,local_1740);
  local_1620 = vsubps_avx(auVar115,local_1760);
  _local_1660 = vsubps_avx(auVar19,local_1780);
  fVar16 = local_1760._0_4_;
  fVar141 = auVar115._0_4_ + fVar16;
  fVar18 = local_1760._4_4_;
  fVar148 = auVar115._4_4_ + fVar18;
  fVar117 = local_1760._8_4_;
  fVar149 = auVar115._8_4_ + fVar117;
  fVar127 = local_1760._12_4_;
  fVar150 = auVar115._12_4_ + fVar127;
  fVar129 = local_1760._16_4_;
  fVar151 = auVar115._16_4_ + fVar129;
  fVar131 = local_1760._20_4_;
  fVar152 = auVar115._20_4_ + fVar131;
  fVar14 = local_1760._24_4_;
  fVar153 = auVar115._24_4_ + fVar14;
  fVar111 = local_1760._28_4_;
  fVar238 = local_1780._0_4_;
  fVar154 = fVar238 + auVar19._0_4_;
  fVar241 = local_1780._4_4_;
  fVar160 = fVar241 + auVar19._4_4_;
  fVar243 = local_1780._8_4_;
  fVar162 = fVar243 + auVar19._8_4_;
  fVar245 = local_1780._12_4_;
  fVar164 = fVar245 + auVar19._12_4_;
  fVar247 = local_1780._16_4_;
  fVar166 = fVar247 + auVar19._16_4_;
  fVar249 = local_1780._20_4_;
  fVar168 = fVar249 + auVar19._20_4_;
  fVar251 = local_1780._24_4_;
  fVar170 = fVar251 + auVar19._24_4_;
  fVar140 = local_1780._28_4_;
  fVar99 = local_1660._0_4_;
  fVar104 = local_1660._4_4_;
  auVar20._4_4_ = fVar104 * fVar148;
  auVar20._0_4_ = fVar99 * fVar141;
  fVar105 = local_1660._8_4_;
  auVar20._8_4_ = fVar105 * fVar149;
  fVar106 = local_1660._12_4_;
  auVar20._12_4_ = fVar106 * fVar150;
  fVar107 = local_1660._16_4_;
  auVar20._16_4_ = fVar107 * fVar151;
  fVar108 = local_1660._20_4_;
  auVar20._20_4_ = fVar108 * fVar152;
  fVar109 = local_1660._24_4_;
  auVar20._24_4_ = fVar109 * fVar153;
  auVar20._28_4_ = auVar176._12_4_;
  fVar216 = local_1620._0_4_;
  fVar220 = local_1620._4_4_;
  auVar21._4_4_ = fVar220 * fVar160;
  auVar21._0_4_ = fVar216 * fVar154;
  fVar222 = local_1620._8_4_;
  auVar21._8_4_ = fVar222 * fVar162;
  fVar224 = local_1620._12_4_;
  auVar21._12_4_ = fVar224 * fVar164;
  fVar226 = local_1620._16_4_;
  auVar21._16_4_ = fVar226 * fVar166;
  fVar228 = local_1620._20_4_;
  auVar21._20_4_ = fVar228 * fVar168;
  fVar230 = local_1620._24_4_;
  auVar21._24_4_ = fVar230 * fVar170;
  auVar21._28_4_ = auVar100._12_4_;
  auVar20 = vsubps_avx(auVar21,auVar20);
  fVar17 = local_1740._0_4_;
  fVar175 = auVar114._0_4_ + fVar17;
  fVar110 = local_1740._4_4_;
  fVar181 = auVar114._4_4_ + fVar110;
  fVar118 = local_1740._8_4_;
  fVar182 = auVar114._8_4_ + fVar118;
  fVar128 = local_1740._12_4_;
  fVar183 = auVar114._12_4_ + fVar128;
  fVar130 = local_1740._16_4_;
  fVar184 = auVar114._16_4_ + fVar130;
  fVar13 = local_1740._20_4_;
  fVar185 = auVar114._20_4_ + fVar13;
  fVar15 = local_1740._24_4_;
  fVar186 = auVar114._24_4_ + fVar15;
  fVar207 = local_1600._0_4_;
  fVar210 = local_1600._4_4_;
  auVar22._4_4_ = fVar210 * fVar160;
  auVar22._0_4_ = fVar207 * fVar154;
  fVar211 = local_1600._8_4_;
  auVar22._8_4_ = fVar211 * fVar162;
  fVar212 = local_1600._12_4_;
  auVar22._12_4_ = fVar212 * fVar164;
  fVar213 = local_1600._16_4_;
  auVar22._16_4_ = fVar213 * fVar166;
  fVar214 = local_1600._20_4_;
  auVar22._20_4_ = fVar214 * fVar168;
  fVar215 = local_1600._24_4_;
  auVar22._24_4_ = fVar215 * fVar170;
  auVar22._28_4_ = fVar140 + auVar19._28_4_;
  auVar124 = _local_1660;
  auVar23._4_4_ = fVar104 * fVar181;
  auVar23._0_4_ = fVar99 * fVar175;
  auVar23._8_4_ = fVar105 * fVar182;
  auVar23._12_4_ = fVar106 * fVar183;
  auVar23._16_4_ = fVar107 * fVar184;
  auVar23._20_4_ = fVar108 * fVar185;
  auVar23._24_4_ = fVar109 * fVar186;
  auVar23._28_4_ = uVar3;
  auVar21 = vsubps_avx(auVar23,auVar22);
  auVar39._4_4_ = fVar220 * fVar181;
  auVar39._0_4_ = fVar216 * fVar175;
  auVar39._8_4_ = fVar222 * fVar182;
  auVar39._12_4_ = fVar224 * fVar183;
  auVar39._16_4_ = fVar226 * fVar184;
  auVar39._20_4_ = fVar228 * fVar185;
  auVar39._24_4_ = fVar230 * fVar186;
  auVar39._28_4_ = auVar114._28_4_ + local_1740._28_4_;
  auVar40._4_4_ = fVar210 * fVar148;
  auVar40._0_4_ = fVar207 * fVar141;
  auVar40._8_4_ = fVar211 * fVar149;
  auVar40._12_4_ = fVar212 * fVar150;
  auVar40._16_4_ = fVar213 * fVar151;
  auVar40._20_4_ = fVar214 * fVar152;
  auVar40._24_4_ = fVar215 * fVar153;
  auVar40._28_4_ = auVar115._28_4_ + fVar111;
  auVar22 = vsubps_avx(auVar40,auVar39);
  local_1880._4_4_ = (ray->dir).field_0.m128[1];
  fVar141 = (ray->dir).field_0.m128[2];
  local_1640._4_4_ = fVar141;
  local_1640._0_4_ = fVar141;
  local_1640._8_4_ = fVar141;
  local_1640._12_4_ = fVar141;
  local_1640._16_4_ = fVar141;
  local_1640._20_4_ = fVar141;
  local_1640._24_4_ = fVar141;
  local_1640._28_4_ = fVar141;
  local_1860._4_4_ = (ray->dir).field_0.m128[0];
  local_16a0._0_4_ =
       auVar20._0_4_ * local_1860._4_4_ + local_1880._4_4_ * auVar21._0_4_ + fVar141 * auVar22._0_4_
  ;
  local_16a0._4_4_ =
       auVar20._4_4_ * local_1860._4_4_ + local_1880._4_4_ * auVar21._4_4_ + fVar141 * auVar22._4_4_
  ;
  local_16a0._8_4_ =
       auVar20._8_4_ * local_1860._4_4_ + local_1880._4_4_ * auVar21._8_4_ + fVar141 * auVar22._8_4_
  ;
  local_16a0._12_4_ =
       auVar20._12_4_ * local_1860._4_4_ +
       local_1880._4_4_ * auVar21._12_4_ + fVar141 * auVar22._12_4_;
  local_16a0._16_4_ =
       auVar20._16_4_ * local_1860._4_4_ +
       local_1880._4_4_ * auVar21._16_4_ + fVar141 * auVar22._16_4_;
  local_16a0._20_4_ =
       auVar20._20_4_ * local_1860._4_4_ +
       local_1880._4_4_ * auVar21._20_4_ + fVar141 * auVar22._20_4_;
  local_16a0._24_4_ =
       auVar20._24_4_ * local_1860._4_4_ +
       local_1880._4_4_ * auVar21._24_4_ + fVar141 * auVar22._24_4_;
  local_16a0._28_4_ = auVar21._28_4_ + auVar21._28_4_ + auVar22._28_4_;
  auVar20 = vsubps_avx(local_1760,auVar121);
  _local_1680 = vsubps_avx(local_1780,auVar103);
  fVar148 = auVar121._0_4_ + fVar16;
  fVar149 = auVar121._4_4_ + fVar18;
  fVar150 = auVar121._8_4_ + fVar117;
  fVar151 = auVar121._12_4_ + fVar127;
  fVar152 = auVar121._16_4_ + fVar129;
  fVar153 = auVar121._20_4_ + fVar131;
  fVar154 = auVar121._24_4_ + fVar14;
  fVar189 = auVar121._28_4_;
  fVar160 = fVar238 + auVar103._0_4_;
  fVar162 = fVar241 + auVar103._4_4_;
  fVar164 = fVar243 + auVar103._8_4_;
  fVar166 = fVar245 + auVar103._12_4_;
  fVar168 = fVar247 + auVar103._16_4_;
  fVar170 = fVar249 + auVar103._20_4_;
  fVar175 = fVar251 + auVar103._24_4_;
  fVar217 = local_1680._0_4_;
  fVar221 = local_1680._4_4_;
  auVar41._4_4_ = fVar221 * fVar149;
  auVar41._0_4_ = fVar217 * fVar148;
  fVar223 = local_1680._8_4_;
  auVar41._8_4_ = fVar223 * fVar150;
  fVar225 = local_1680._12_4_;
  auVar41._12_4_ = fVar225 * fVar151;
  fVar227 = local_1680._16_4_;
  auVar41._16_4_ = fVar227 * fVar152;
  fVar229 = local_1680._20_4_;
  auVar41._20_4_ = fVar229 * fVar153;
  fVar231 = local_1680._24_4_;
  auVar41._24_4_ = fVar231 * fVar154;
  auVar41._28_4_ = fVar140;
  fVar190 = auVar20._0_4_;
  fVar193 = auVar20._4_4_;
  auVar42._4_4_ = fVar193 * fVar162;
  auVar42._0_4_ = fVar190 * fVar160;
  fVar195 = auVar20._8_4_;
  auVar42._8_4_ = fVar195 * fVar164;
  fVar197 = auVar20._12_4_;
  auVar42._12_4_ = fVar197 * fVar166;
  fVar199 = auVar20._16_4_;
  auVar42._16_4_ = fVar199 * fVar168;
  fVar201 = auVar20._20_4_;
  auVar42._20_4_ = fVar201 * fVar170;
  fVar203 = auVar20._24_4_;
  auVar42._24_4_ = fVar203 * fVar175;
  auVar42._28_4_ = fVar111;
  auVar21 = vsubps_avx(auVar42,auVar41);
  auVar22 = vsubps_avx(local_1740,auVar102);
  fVar239 = auVar22._0_4_;
  fVar242 = auVar22._4_4_;
  auVar43._4_4_ = fVar242 * fVar162;
  auVar43._0_4_ = fVar239 * fVar160;
  fVar244 = auVar22._8_4_;
  auVar43._8_4_ = fVar244 * fVar164;
  fVar246 = auVar22._12_4_;
  auVar43._12_4_ = fVar246 * fVar166;
  fVar248 = auVar22._16_4_;
  auVar43._16_4_ = fVar248 * fVar168;
  fVar250 = auVar22._20_4_;
  auVar43._20_4_ = fVar250 * fVar170;
  fVar252 = auVar22._24_4_;
  auVar43._24_4_ = fVar252 * fVar175;
  auVar43._28_4_ = fVar140 + auVar103._28_4_;
  fVar160 = auVar102._0_4_ + fVar17;
  fVar162 = auVar102._4_4_ + fVar110;
  fVar164 = auVar102._8_4_ + fVar118;
  fVar166 = auVar102._12_4_ + fVar128;
  fVar168 = auVar102._16_4_ + fVar130;
  fVar170 = auVar102._20_4_ + fVar13;
  fVar175 = auVar102._24_4_ + fVar15;
  fVar187 = auVar102._28_4_ + local_1740._28_4_;
  auVar44._4_4_ = fVar221 * fVar162;
  auVar44._0_4_ = fVar217 * fVar160;
  auVar44._8_4_ = fVar223 * fVar164;
  auVar44._12_4_ = fVar225 * fVar166;
  auVar44._16_4_ = fVar227 * fVar168;
  auVar44._20_4_ = fVar229 * fVar170;
  auVar44._24_4_ = fVar231 * fVar175;
  auVar44._28_4_ = local_1680._28_4_;
  auVar22 = vsubps_avx(auVar44,auVar43);
  auVar45._4_4_ = fVar193 * fVar162;
  auVar45._0_4_ = fVar190 * fVar160;
  auVar45._8_4_ = fVar195 * fVar164;
  auVar45._12_4_ = fVar197 * fVar166;
  auVar45._16_4_ = fVar199 * fVar168;
  auVar45._20_4_ = fVar201 * fVar170;
  auVar45._24_4_ = fVar203 * fVar175;
  auVar45._28_4_ = fVar187;
  auVar46._4_4_ = fVar242 * fVar149;
  auVar46._0_4_ = fVar239 * fVar148;
  auVar46._8_4_ = fVar244 * fVar150;
  auVar46._12_4_ = fVar246 * fVar151;
  auVar46._16_4_ = fVar248 * fVar152;
  auVar46._20_4_ = fVar250 * fVar153;
  auVar46._24_4_ = fVar252 * fVar154;
  auVar46._28_4_ = fVar189 + fVar111;
  auVar23 = vsubps_avx(auVar46,auVar45);
  local_16c0._0_4_ =
       local_1860._4_4_ * auVar21._0_4_ + local_1880._4_4_ * auVar22._0_4_ + fVar141 * auVar23._0_4_
  ;
  local_16c0._4_4_ =
       local_1860._4_4_ * auVar21._4_4_ + local_1880._4_4_ * auVar22._4_4_ + fVar141 * auVar23._4_4_
  ;
  fStack_16b8 = local_1860._4_4_ * auVar21._8_4_ +
                local_1880._4_4_ * auVar22._8_4_ + fVar141 * auVar23._8_4_;
  fStack_16b4 = local_1860._4_4_ * auVar21._12_4_ +
                local_1880._4_4_ * auVar22._12_4_ + fVar141 * auVar23._12_4_;
  register0x00001310 =
       local_1860._4_4_ * auVar21._16_4_ +
       local_1880._4_4_ * auVar22._16_4_ + fVar141 * auVar23._16_4_;
  register0x00001314 =
       local_1860._4_4_ * auVar21._20_4_ +
       local_1880._4_4_ * auVar22._20_4_ + fVar141 * auVar23._20_4_;
  register0x00001318 =
       local_1860._4_4_ * auVar21._24_4_ +
       local_1880._4_4_ * auVar22._24_4_ + fVar141 * auVar23._24_4_;
  register0x0000131c = auVar21._28_4_ + auVar22._28_4_ + auVar23._28_4_;
  auVar21 = vsubps_avx(auVar102,auVar114);
  fVar154 = auVar102._0_4_ + auVar114._0_4_;
  fVar160 = auVar102._4_4_ + auVar114._4_4_;
  fVar162 = auVar102._8_4_ + auVar114._8_4_;
  fVar164 = auVar102._12_4_ + auVar114._12_4_;
  fVar166 = auVar102._16_4_ + auVar114._16_4_;
  fVar168 = auVar102._20_4_ + auVar114._20_4_;
  fVar170 = auVar102._24_4_ + auVar114._24_4_;
  fVar175 = auVar102._28_4_ + auVar114._28_4_;
  auVar102 = vsubps_avx(auVar121,auVar115);
  fVar111 = auVar121._0_4_ + auVar115._0_4_;
  fVar148 = auVar121._4_4_ + auVar115._4_4_;
  fVar149 = auVar121._8_4_ + auVar115._8_4_;
  fVar150 = auVar121._12_4_ + auVar115._12_4_;
  fVar151 = auVar121._16_4_ + auVar115._16_4_;
  fVar152 = auVar121._20_4_ + auVar115._20_4_;
  fVar153 = auVar121._24_4_ + auVar115._24_4_;
  auVar114 = vsubps_avx(auVar103,auVar19);
  fVar181 = auVar103._0_4_ + auVar19._0_4_;
  fVar182 = auVar103._4_4_ + auVar19._4_4_;
  fVar183 = auVar103._8_4_ + auVar19._8_4_;
  fVar184 = auVar103._12_4_ + auVar19._12_4_;
  fVar185 = auVar103._16_4_ + auVar19._16_4_;
  fVar186 = auVar103._20_4_ + auVar19._20_4_;
  fVar140 = auVar103._24_4_ + auVar19._24_4_;
  fVar155 = auVar114._0_4_;
  fVar161 = auVar114._4_4_;
  auVar47._4_4_ = fVar161 * fVar148;
  auVar47._0_4_ = fVar155 * fVar111;
  fVar163 = auVar114._8_4_;
  auVar47._8_4_ = fVar163 * fVar149;
  fVar165 = auVar114._12_4_;
  auVar47._12_4_ = fVar165 * fVar150;
  fVar167 = auVar114._16_4_;
  auVar47._16_4_ = fVar167 * fVar151;
  fVar169 = auVar114._20_4_;
  auVar47._20_4_ = fVar169 * fVar152;
  fVar171 = auVar114._24_4_;
  auVar47._24_4_ = fVar171 * fVar153;
  auVar47._28_4_ = fVar187;
  fVar187 = auVar102._0_4_;
  fVar194 = auVar102._4_4_;
  auVar48._4_4_ = fVar194 * fVar182;
  auVar48._0_4_ = fVar187 * fVar181;
  fVar196 = auVar102._8_4_;
  auVar48._8_4_ = fVar196 * fVar183;
  fVar198 = auVar102._12_4_;
  auVar48._12_4_ = fVar198 * fVar184;
  fVar200 = auVar102._16_4_;
  auVar48._16_4_ = fVar200 * fVar185;
  fVar202 = auVar102._20_4_;
  auVar48._20_4_ = fVar202 * fVar186;
  fVar204 = auVar102._24_4_;
  auVar48._24_4_ = fVar204 * fVar140;
  auVar48._28_4_ = fVar189;
  auVar102 = vsubps_avx(auVar48,auVar47);
  fVar232 = auVar21._0_4_;
  fVar234 = auVar21._4_4_;
  auVar49._4_4_ = fVar234 * fVar182;
  auVar49._0_4_ = fVar232 * fVar181;
  fVar181 = auVar21._8_4_;
  auVar49._8_4_ = fVar181 * fVar183;
  fVar182 = auVar21._12_4_;
  auVar49._12_4_ = fVar182 * fVar184;
  fVar183 = auVar21._16_4_;
  auVar49._16_4_ = fVar183 * fVar185;
  fVar184 = auVar21._20_4_;
  auVar49._20_4_ = fVar184 * fVar186;
  fVar185 = auVar21._24_4_;
  auVar49._24_4_ = fVar185 * fVar140;
  auVar49._28_4_ = auVar103._28_4_ + auVar19._28_4_;
  auVar19._4_4_ = fVar161 * fVar160;
  auVar19._0_4_ = fVar155 * fVar154;
  auVar19._8_4_ = fVar163 * fVar162;
  auVar19._12_4_ = fVar165 * fVar164;
  auVar19._16_4_ = fVar167 * fVar166;
  auVar19._20_4_ = fVar169 * fVar168;
  auVar19._24_4_ = fVar171 * fVar170;
  auVar19._28_4_ = fVar189;
  auVar121 = vsubps_avx(auVar19,auVar49);
  auVar50._4_4_ = fVar194 * fVar160;
  auVar50._0_4_ = fVar187 * fVar154;
  auVar50._8_4_ = fVar196 * fVar162;
  auVar50._12_4_ = fVar198 * fVar164;
  auVar50._16_4_ = fVar200 * fVar166;
  auVar50._20_4_ = fVar202 * fVar168;
  auVar50._24_4_ = fVar204 * fVar170;
  auVar50._28_4_ = fVar175;
  auVar51._4_4_ = fVar234 * fVar148;
  auVar51._0_4_ = fVar232 * fVar111;
  auVar51._8_4_ = fVar181 * fVar149;
  auVar51._12_4_ = fVar182 * fVar150;
  auVar51._16_4_ = fVar183 * fVar151;
  auVar51._20_4_ = fVar184 * fVar152;
  auVar51._24_4_ = fVar185 * fVar153;
  auVar51._28_4_ = fVar189 + auVar115._28_4_;
  auVar103 = vsubps_avx(auVar51,auVar50);
  local_1880._0_4_ = local_1880._4_4_;
  fStack_1878 = local_1880._4_4_;
  fStack_1874 = local_1880._4_4_;
  fStack_1870 = local_1880._4_4_;
  fStack_186c = local_1880._4_4_;
  fStack_1868 = local_1880._4_4_;
  fStack_1864 = local_1880._4_4_;
  local_1860._0_4_ = local_1860._4_4_;
  fStack_1858 = local_1860._4_4_;
  fStack_1854 = local_1860._4_4_;
  fStack_1850 = local_1860._4_4_;
  fStack_184c = local_1860._4_4_;
  fStack_1848 = local_1860._4_4_;
  fStack_1844 = local_1860._4_4_;
  auVar115._0_4_ =
       local_1860._4_4_ * auVar102._0_4_ +
       local_1880._4_4_ * auVar121._0_4_ + fVar141 * auVar103._0_4_;
  auVar115._4_4_ =
       local_1860._4_4_ * auVar102._4_4_ +
       local_1880._4_4_ * auVar121._4_4_ + fVar141 * auVar103._4_4_;
  auVar115._8_4_ =
       local_1860._4_4_ * auVar102._8_4_ +
       local_1880._4_4_ * auVar121._8_4_ + fVar141 * auVar103._8_4_;
  auVar115._12_4_ =
       local_1860._4_4_ * auVar102._12_4_ +
       local_1880._4_4_ * auVar121._12_4_ + fVar141 * auVar103._12_4_;
  auVar115._16_4_ =
       local_1860._4_4_ * auVar102._16_4_ +
       local_1880._4_4_ * auVar121._16_4_ + fVar141 * auVar103._16_4_;
  auVar115._20_4_ =
       local_1860._4_4_ * auVar102._20_4_ +
       local_1880._4_4_ * auVar121._20_4_ + fVar141 * auVar103._20_4_;
  auVar115._24_4_ =
       local_1860._4_4_ * auVar102._24_4_ +
       local_1880._4_4_ * auVar121._24_4_ + fVar141 * auVar103._24_4_;
  auVar115._28_4_ = fVar175 + fVar175 + auVar103._28_4_;
  local_1700._0_4_ = auVar115._0_4_ + local_16a0._0_4_ + (float)local_16c0._0_4_;
  local_1700._4_4_ = auVar115._4_4_ + local_16a0._4_4_ + (float)local_16c0._4_4_;
  fStack_16f8 = auVar115._8_4_ + local_16a0._8_4_ + fStack_16b8;
  fStack_16f4 = auVar115._12_4_ + local_16a0._12_4_ + fStack_16b4;
  register0x00001210 = auVar115._16_4_ + local_16a0._16_4_ + register0x00001310;
  register0x00001214 = auVar115._20_4_ + local_16a0._20_4_ + register0x00001314;
  register0x00001218 = auVar115._24_4_ + local_16a0._24_4_ + register0x00001318;
  register0x0000121c = auVar115._28_4_ + local_16a0._28_4_ + register0x0000131c;
  auVar102 = vminps_avx(local_16a0,_local_16c0);
  auVar102 = vminps_avx(auVar102,auVar115);
  auVar136._8_4_ = 0x7fffffff;
  auVar136._0_8_ = 0x7fffffff7fffffff;
  auVar136._12_4_ = 0x7fffffff;
  auVar136._16_4_ = 0x7fffffff;
  auVar136._20_4_ = 0x7fffffff;
  auVar136._24_4_ = 0x7fffffff;
  auVar136._28_4_ = 0x7fffffff;
  _local_16e0 = vandps_avx(_local_1700,auVar136);
  fVar111 = local_16e0._0_4_ * 1.1920929e-07;
  fVar148 = local_16e0._4_4_ * 1.1920929e-07;
  local_1300._4_4_ = fVar148;
  local_1300._0_4_ = fVar111;
  fVar149 = local_16e0._8_4_ * 1.1920929e-07;
  local_1300._8_4_ = fVar149;
  fVar150 = local_16e0._12_4_ * 1.1920929e-07;
  local_1300._12_4_ = fVar150;
  fVar151 = local_16e0._16_4_ * 1.1920929e-07;
  local_1300._16_4_ = fVar151;
  fVar152 = local_16e0._20_4_ * 1.1920929e-07;
  local_1300._20_4_ = fVar152;
  fVar153 = local_16e0._24_4_ * 1.1920929e-07;
  local_1300._24_4_ = fVar153;
  local_1300._28_4_ = 0x34000000;
  auVar178._0_8_ = CONCAT44(fVar148,fVar111) ^ 0x8000000080000000;
  auVar178._8_4_ = -fVar149;
  auVar178._12_4_ = -fVar150;
  auVar178._16_4_ = -fVar151;
  auVar178._20_4_ = -fVar152;
  auVar178._24_4_ = -fVar153;
  auVar178._28_4_ = 0xb4000000;
  local_12a0 = vcmpps_avx(auVar102,auVar178,5);
  auVar121 = vmaxps_avx(local_16a0,_local_16c0);
  auVar102 = vmaxps_avx(auVar121,auVar115);
  auVar102 = vcmpps_avx(auVar102,local_1300,2);
  auVar116 = ZEXT3264(auVar102);
  auVar102 = vorps_avx(local_12a0,auVar102);
  if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar102 >> 0x7f,0) == '\0') &&
        (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar102 >> 0xbf,0) == '\0') &&
      (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar102[0x1f]) {
LAB_00e718ad:
    auVar139 = ZEXT3264(local_1300);
    auVar126 = ZEXT3264(local_12a0);
    auVar180 = ZEXT3264(local_14c0);
    auVar188 = ZEXT3264(local_14e0);
    auVar192 = ZEXT3264(local_1500);
    auVar206 = ZEXT3264(local_1520);
    auVar209 = ZEXT3264(local_1540);
    auVar219 = ZEXT3264(local_1560);
    auVar233 = ZEXT3264(local_1580);
    auVar237 = ZEXT3264(local_15a0);
    auVar240 = ZEXT3264(local_15c0);
    auVar159 = ZEXT3264(local_15e0);
  }
  else {
    local_1720 = auVar102;
    auVar52._4_4_ = fVar193 * fVar104;
    auVar52._0_4_ = fVar190 * fVar99;
    auVar52._8_4_ = fVar195 * fVar105;
    auVar52._12_4_ = fVar197 * fVar106;
    auVar52._16_4_ = fVar199 * fVar107;
    auVar52._20_4_ = fVar201 * fVar108;
    auVar52._24_4_ = fVar203 * fVar109;
    auVar52._28_4_ = local_12a0._28_4_;
    auVar53._4_4_ = fVar221 * fVar220;
    auVar53._0_4_ = fVar217 * fVar216;
    auVar53._8_4_ = fVar223 * fVar222;
    auVar53._12_4_ = fVar225 * fVar224;
    auVar53._16_4_ = fVar227 * fVar226;
    auVar53._20_4_ = fVar229 * fVar228;
    auVar53._24_4_ = fVar231 * fVar230;
    auVar53._28_4_ = 0x34000000;
    auVar115 = vsubps_avx(auVar53,auVar52);
    auVar54._4_4_ = fVar221 * fVar194;
    auVar54._0_4_ = fVar217 * fVar187;
    auVar54._8_4_ = fVar223 * fVar196;
    auVar54._12_4_ = fVar225 * fVar198;
    auVar54._16_4_ = fVar227 * fVar200;
    auVar54._20_4_ = fVar229 * fVar202;
    auVar54._24_4_ = fVar231 * fVar204;
    auVar54._28_4_ = auVar121._28_4_;
    auVar55._4_4_ = fVar193 * fVar161;
    auVar55._0_4_ = fVar190 * fVar155;
    auVar55._8_4_ = fVar195 * fVar163;
    auVar55._12_4_ = fVar197 * fVar165;
    auVar55._16_4_ = fVar199 * fVar167;
    auVar55._20_4_ = fVar201 * fVar169;
    auVar55._24_4_ = fVar203 * fVar171;
    auVar55._28_4_ = auVar20._28_4_;
    auVar19 = vsubps_avx(auVar55,auVar54);
    auVar147._8_4_ = 0x7fffffff;
    auVar147._0_8_ = 0x7fffffff7fffffff;
    auVar147._12_4_ = 0x7fffffff;
    auVar147._16_4_ = 0x7fffffff;
    auVar147._20_4_ = 0x7fffffff;
    auVar147._24_4_ = 0x7fffffff;
    auVar147._28_4_ = 0x7fffffff;
    auVar121 = vandps_avx(auVar52,auVar147);
    auVar103 = vandps_avx(auVar54,auVar147);
    auVar121 = vcmpps_avx(auVar121,auVar103,1);
    local_1360 = vblendvps_avx(auVar19,auVar115,auVar121);
    auVar56._4_4_ = fVar242 * fVar161;
    auVar56._0_4_ = fVar239 * fVar155;
    auVar56._8_4_ = fVar244 * fVar163;
    auVar56._12_4_ = fVar246 * fVar165;
    auVar56._16_4_ = fVar248 * fVar167;
    auVar56._20_4_ = fVar250 * fVar169;
    auVar56._24_4_ = fVar252 * fVar171;
    auVar56._28_4_ = auVar121._28_4_;
    auVar57._4_4_ = fVar242 * fVar104;
    auVar57._0_4_ = fVar239 * fVar99;
    auVar57._8_4_ = fVar244 * fVar105;
    auVar57._12_4_ = fVar246 * fVar106;
    auVar57._16_4_ = fVar248 * fVar107;
    auVar57._20_4_ = fVar250 * fVar108;
    auVar57._24_4_ = fVar252 * fVar109;
    auVar57._28_4_ = auVar115._28_4_;
    auVar58._4_4_ = fVar210 * fVar221;
    auVar58._0_4_ = fVar207 * fVar217;
    auVar58._8_4_ = fVar211 * fVar223;
    auVar58._12_4_ = fVar212 * fVar225;
    auVar58._16_4_ = fVar213 * fVar227;
    auVar58._20_4_ = fVar214 * fVar229;
    auVar58._24_4_ = fVar215 * fVar231;
    auVar58._28_4_ = fVar141;
    auVar115 = vsubps_avx(auVar57,auVar58);
    auVar59._4_4_ = fVar221 * fVar234;
    auVar59._0_4_ = fVar217 * fVar232;
    auVar59._8_4_ = fVar223 * fVar181;
    auVar59._12_4_ = fVar225 * fVar182;
    auVar59._16_4_ = fVar227 * fVar183;
    auVar59._20_4_ = fVar229 * fVar184;
    auVar59._24_4_ = fVar231 * fVar185;
    auVar59._28_4_ = auVar103._28_4_;
    auVar19 = vsubps_avx(auVar59,auVar56);
    auVar121 = vandps_avx(auVar58,auVar147);
    auVar103 = vandps_avx(auVar56,auVar147);
    auVar121 = vcmpps_avx(auVar121,auVar103,1);
    local_1340 = vblendvps_avx(auVar19,auVar115,auVar121);
    auVar60._4_4_ = fVar193 * fVar234;
    auVar60._0_4_ = fVar190 * fVar232;
    auVar60._8_4_ = fVar195 * fVar181;
    auVar60._12_4_ = fVar197 * fVar182;
    auVar60._16_4_ = fVar199 * fVar183;
    auVar60._20_4_ = fVar201 * fVar184;
    auVar60._24_4_ = fVar203 * fVar185;
    auVar60._28_4_ = auVar121._28_4_;
    auVar61._4_4_ = fVar210 * fVar193;
    auVar61._0_4_ = fVar207 * fVar190;
    auVar61._8_4_ = fVar211 * fVar195;
    auVar61._12_4_ = fVar212 * fVar197;
    auVar61._16_4_ = fVar213 * fVar199;
    auVar61._20_4_ = fVar214 * fVar201;
    auVar61._24_4_ = fVar215 * fVar203;
    auVar61._28_4_ = auVar115._28_4_;
    auVar62._4_4_ = fVar242 * fVar220;
    auVar62._0_4_ = fVar239 * fVar216;
    auVar62._8_4_ = fVar244 * fVar222;
    auVar62._12_4_ = fVar246 * fVar224;
    auVar62._16_4_ = fVar248 * fVar226;
    auVar62._20_4_ = fVar250 * fVar228;
    auVar62._24_4_ = fVar252 * fVar230;
    auVar62._28_4_ = auVar114._28_4_;
    auVar63._4_4_ = fVar242 * fVar194;
    auVar63._0_4_ = fVar239 * fVar187;
    auVar63._8_4_ = fVar244 * fVar196;
    auVar63._12_4_ = fVar246 * fVar198;
    auVar63._16_4_ = fVar248 * fVar200;
    auVar63._20_4_ = fVar250 * fVar202;
    auVar63._24_4_ = fVar252 * fVar204;
    auVar63._28_4_ = uStack_1644;
    auVar114 = vsubps_avx(auVar61,auVar62);
    auVar115 = vsubps_avx(auVar63,auVar60);
    auVar121 = vandps_avx(auVar62,auVar147);
    auVar103 = vandps_avx(auVar60,auVar147);
    auVar103 = vcmpps_avx(auVar121,auVar103,1);
    local_1320 = vblendvps_avx(auVar115,auVar114,auVar103);
    auVar101 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
    fVar99 = local_1320._0_4_;
    fVar104 = local_1320._4_4_;
    fVar105 = local_1320._8_4_;
    fVar106 = local_1320._12_4_;
    fVar107 = local_1320._16_4_;
    fVar108 = local_1320._20_4_;
    fVar109 = local_1320._24_4_;
    fVar154 = local_1340._0_4_;
    fVar160 = local_1340._4_4_;
    fVar162 = local_1340._8_4_;
    fVar164 = local_1340._12_4_;
    fVar166 = local_1340._16_4_;
    fVar168 = local_1340._20_4_;
    fVar170 = local_1340._24_4_;
    fVar175 = local_1360._0_4_;
    fVar181 = local_1360._4_4_;
    fVar182 = local_1360._8_4_;
    fVar183 = local_1360._12_4_;
    fVar184 = local_1360._16_4_;
    fVar185 = local_1360._20_4_;
    fVar186 = local_1360._24_4_;
    fVar111 = fVar175 * local_1860._4_4_ + fVar154 * local_1880._4_4_ + fVar99 * fVar141;
    fVar148 = fVar181 * local_1860._4_4_ + fVar160 * local_1880._4_4_ + fVar104 * fVar141;
    fVar149 = fVar182 * local_1860._4_4_ + fVar162 * local_1880._4_4_ + fVar105 * fVar141;
    fVar150 = fVar183 * local_1860._4_4_ + fVar164 * local_1880._4_4_ + fVar106 * fVar141;
    fVar151 = fVar184 * local_1860._4_4_ + fVar166 * local_1880._4_4_ + fVar107 * fVar141;
    fVar152 = fVar185 * local_1860._4_4_ + fVar168 * local_1880._4_4_ + fVar108 * fVar141;
    fVar141 = fVar186 * local_1860._4_4_ + fVar170 * local_1880._4_4_ + fVar109 * fVar141;
    fVar153 = auVar114._28_4_ + auVar114._28_4_ + 0.0;
    auVar137._0_4_ = fVar111 + fVar111;
    auVar137._4_4_ = fVar148 + fVar148;
    auVar137._8_4_ = fVar149 + fVar149;
    auVar137._12_4_ = fVar150 + fVar150;
    auVar137._16_4_ = fVar151 + fVar151;
    auVar137._20_4_ = fVar152 + fVar152;
    auVar137._24_4_ = fVar141 + fVar141;
    auVar137._28_4_ = fVar153 + fVar153;
    fVar111 = auVar121._28_4_;
    auVar102 = vrcpps_avx(auVar137);
    fVar148 = fVar175 * fVar17 + fVar154 * fVar16 + fVar99 * fVar238;
    fVar149 = fVar181 * fVar110 + fVar160 * fVar18 + fVar104 * fVar241;
    fVar150 = fVar182 * fVar118 + fVar162 * fVar117 + fVar105 * fVar243;
    fVar127 = fVar183 * fVar128 + fVar164 * fVar127 + fVar106 * fVar245;
    fVar128 = fVar184 * fVar130 + fVar166 * fVar129 + fVar107 * fVar247;
    fVar129 = fVar185 * fVar13 + fVar168 * fVar131 + fVar108 * fVar249;
    fVar130 = fVar186 * fVar15 + fVar170 * fVar14 + fVar109 * fVar251;
    fVar131 = fVar111 + fVar111 + fVar153;
    fVar141 = auVar102._0_4_;
    fVar16 = auVar102._4_4_;
    auVar64._4_4_ = auVar137._4_4_ * fVar16;
    auVar64._0_4_ = auVar137._0_4_ * fVar141;
    fVar17 = auVar102._8_4_;
    auVar64._8_4_ = auVar137._8_4_ * fVar17;
    fVar18 = auVar102._12_4_;
    auVar64._12_4_ = auVar137._12_4_ * fVar18;
    fVar110 = auVar102._16_4_;
    auVar64._16_4_ = auVar137._16_4_ * fVar110;
    fVar117 = auVar102._20_4_;
    auVar64._20_4_ = auVar137._20_4_ * fVar117;
    fVar118 = auVar102._24_4_;
    auVar64._24_4_ = auVar137._24_4_ * fVar118;
    auVar64._28_4_ = fVar111;
    auVar179._8_4_ = 0x3f800000;
    auVar179._0_8_ = 0x3f8000003f800000;
    auVar179._12_4_ = 0x3f800000;
    auVar179._16_4_ = 0x3f800000;
    auVar179._20_4_ = 0x3f800000;
    auVar179._24_4_ = 0x3f800000;
    auVar179._28_4_ = 0x3f800000;
    auVar102 = vsubps_avx(auVar179,auVar64);
    uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
    auVar173._4_4_ = uVar3;
    auVar173._0_4_ = uVar3;
    auVar173._8_4_ = uVar3;
    auVar173._12_4_ = uVar3;
    auVar173._16_4_ = uVar3;
    auVar173._20_4_ = uVar3;
    auVar173._24_4_ = uVar3;
    auVar173._28_4_ = uVar3;
    local_12a0._4_4_ = (fVar149 + fVar149) * (fVar16 + fVar16 * auVar102._4_4_);
    local_12a0._0_4_ = (fVar148 + fVar148) * (fVar141 + fVar141 * auVar102._0_4_);
    local_12a0._8_4_ = (fVar150 + fVar150) * (fVar17 + fVar17 * auVar102._8_4_);
    local_12a0._12_4_ = (fVar127 + fVar127) * (fVar18 + fVar18 * auVar102._12_4_);
    local_12a0._16_4_ = (fVar128 + fVar128) * (fVar110 + fVar110 * auVar102._16_4_);
    local_12a0._20_4_ = (fVar129 + fVar129) * (fVar117 + fVar117 * auVar102._20_4_);
    local_12a0._24_4_ = (fVar130 + fVar130) * (fVar118 + fVar118 * auVar102._24_4_);
    local_12a0._28_4_ = fVar131 + fVar131;
    auVar102 = vcmpps_avx(auVar173,local_12a0,2);
    fVar141 = ray->tfar;
    auVar174._4_4_ = fVar141;
    auVar174._0_4_ = fVar141;
    auVar174._8_4_ = fVar141;
    auVar174._12_4_ = fVar141;
    auVar174._16_4_ = fVar141;
    auVar174._20_4_ = fVar141;
    auVar174._24_4_ = fVar141;
    auVar174._28_4_ = fVar141;
    auVar121 = vcmpps_avx(local_12a0,auVar174,2);
    auVar102 = vandps_avx(auVar121,auVar102);
    auVar121 = vcmpps_avx(auVar137,_DAT_01f7b000,4);
    auVar102 = vandps_avx(auVar102,auVar121);
    auVar112 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
    auVar101 = vpand_avx(auVar112,auVar101);
    auVar116 = ZEXT1664(auVar101);
    auVar112 = vpmovsxwd_avx(auVar101);
    auVar100 = vpshufd_avx(auVar101,0xee);
    auVar100 = vpmovsxwd_avx(auVar100);
    local_1300._16_16_ = auVar100;
    local_1300._0_16_ = auVar112;
    if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(local_1300 >> 0x7f,0) == '\0') &&
          (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB161(auVar100 >> 0x3f,0) == '\0') &&
        (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar100[0xf]
       ) goto LAB_00e718ad;
    local_13c0 = local_16a0._0_4_;
    fStack_13bc = local_16a0._4_4_;
    fStack_13b8 = local_16a0._8_4_;
    fStack_13b4 = local_16a0._12_4_;
    fStack_13b0 = local_16a0._16_4_;
    fStack_13ac = local_16a0._20_4_;
    fStack_13a8 = local_16a0._24_4_;
    fStack_13a4 = local_16a0._28_4_;
    local_13a0 = (float)local_16c0._0_4_;
    fStack_139c = (float)local_16c0._4_4_;
    fStack_1398 = fStack_16b8;
    fStack_1394 = fStack_16b4;
    fStack_1390 = register0x00001310;
    fStack_138c = register0x00001314;
    fStack_1388 = register0x00001318;
    fStack_1384 = register0x0000131c;
    local_1380 = _local_1700;
    local_1220 = local_1440;
    auVar102 = vrcpps_avx(_local_1700);
    fVar141 = auVar102._0_4_;
    fVar16 = auVar102._4_4_;
    auVar65._4_4_ = (float)local_1700._4_4_ * fVar16;
    auVar65._0_4_ = (float)local_1700._0_4_ * fVar141;
    fVar17 = auVar102._8_4_;
    auVar65._8_4_ = fStack_16f8 * fVar17;
    fVar18 = auVar102._12_4_;
    auVar65._12_4_ = fStack_16f4 * fVar18;
    fVar110 = auVar102._16_4_;
    auVar65._16_4_ = register0x00001210 * fVar110;
    fVar117 = auVar102._20_4_;
    auVar65._20_4_ = register0x00001214 * fVar117;
    fVar118 = auVar102._24_4_;
    auVar65._24_4_ = register0x00001218 * fVar118;
    auVar65._28_4_ = auVar100._12_4_;
    auVar158._8_4_ = 0x3f800000;
    auVar158._0_8_ = 0x3f8000003f800000;
    auVar158._12_4_ = 0x3f800000;
    auVar158._16_4_ = 0x3f800000;
    auVar158._20_4_ = 0x3f800000;
    auVar158._24_4_ = 0x3f800000;
    auVar158._28_4_ = 0x3f800000;
    auVar121 = vsubps_avx(auVar158,auVar65);
    auVar125._0_4_ = fVar141 + fVar141 * auVar121._0_4_;
    auVar125._4_4_ = fVar16 + fVar16 * auVar121._4_4_;
    auVar125._8_4_ = fVar17 + fVar17 * auVar121._8_4_;
    auVar125._12_4_ = fVar18 + fVar18 * auVar121._12_4_;
    auVar125._16_4_ = fVar110 + fVar110 * auVar121._16_4_;
    auVar125._20_4_ = fVar117 + fVar117 * auVar121._20_4_;
    auVar125._24_4_ = fVar118 + fVar118 * auVar121._24_4_;
    auVar125._28_4_ = auVar102._28_4_ + auVar121._28_4_;
    auVar138._8_4_ = 0x219392ef;
    auVar138._0_8_ = 0x219392ef219392ef;
    auVar138._12_4_ = 0x219392ef;
    auVar138._16_4_ = 0x219392ef;
    auVar138._20_4_ = 0x219392ef;
    auVar138._24_4_ = 0x219392ef;
    auVar138._28_4_ = 0x219392ef;
    auVar121 = vcmpps_avx(_local_16e0,auVar138,5);
    auVar102 = vandps_avx(auVar121,auVar125);
    auVar66._4_4_ = local_16a0._4_4_ * auVar102._4_4_;
    auVar66._0_4_ = local_16a0._0_4_ * auVar102._0_4_;
    auVar66._8_4_ = local_16a0._8_4_ * auVar102._8_4_;
    auVar66._12_4_ = local_16a0._12_4_ * auVar102._12_4_;
    auVar66._16_4_ = local_16a0._16_4_ * auVar102._16_4_;
    auVar66._20_4_ = local_16a0._20_4_ * auVar102._20_4_;
    auVar66._24_4_ = local_16a0._24_4_ * auVar102._24_4_;
    auVar66._28_4_ = auVar121._28_4_;
    auVar121 = vminps_avx(auVar66,auVar158);
    auVar67._4_4_ = (float)local_16c0._4_4_ * auVar102._4_4_;
    auVar67._0_4_ = (float)local_16c0._0_4_ * auVar102._0_4_;
    auVar67._8_4_ = fStack_16b8 * auVar102._8_4_;
    auVar67._12_4_ = fStack_16b4 * auVar102._12_4_;
    auVar67._16_4_ = register0x00001310 * auVar102._16_4_;
    auVar67._20_4_ = register0x00001314 * auVar102._20_4_;
    auVar67._24_4_ = register0x00001318 * auVar102._24_4_;
    auVar67._28_4_ = auVar102._28_4_;
    auVar102 = vminps_avx(auVar67,auVar158);
    auVar103 = vsubps_avx(auVar158,auVar121);
    auVar114 = vsubps_avx(auVar158,auVar102);
    local_12c0 = vblendvps_avx(auVar102,auVar103,local_1440);
    local_12e0 = vblendvps_avx(auVar121,auVar114,local_1440);
    fVar141 = local_1460._0_4_;
    fVar16 = local_1460._4_4_;
    local_1280._4_4_ = fVar181 * fVar16;
    local_1280._0_4_ = fVar175 * fVar141;
    fVar17 = local_1460._8_4_;
    local_1280._8_4_ = fVar182 * fVar17;
    fVar18 = local_1460._12_4_;
    local_1280._12_4_ = fVar183 * fVar18;
    fVar110 = local_1460._16_4_;
    local_1280._16_4_ = fVar184 * fVar110;
    fVar117 = local_1460._20_4_;
    local_1280._20_4_ = fVar185 * fVar117;
    fVar118 = local_1460._24_4_;
    local_1280._24_4_ = fVar186 * fVar118;
    local_1280._28_4_ = local_12c0._28_4_;
    auVar126 = ZEXT3264(local_1280);
    local_1260._4_4_ = fVar160 * fVar16;
    local_1260._0_4_ = fVar154 * fVar141;
    local_1260._8_4_ = fVar162 * fVar17;
    local_1260._12_4_ = fVar164 * fVar18;
    local_1260._16_4_ = fVar166 * fVar110;
    local_1260._20_4_ = fVar168 * fVar117;
    local_1260._24_4_ = fVar170 * fVar118;
    local_1260._28_4_ = local_12e0._28_4_;
    auVar139 = ZEXT3264(local_1260);
    local_1240[0] = fVar141 * fVar99;
    local_1240[1] = fVar16 * fVar104;
    local_1240[2] = fVar17 * fVar105;
    local_1240[3] = fVar18 * fVar106;
    fStack_1230 = fVar110 * fVar107;
    fStack_122c = fVar117 * fVar108;
    fStack_1228 = fVar118 * fVar109;
    uStack_1224 = local_1320._28_4_;
    auVar101 = vpsllw_avx(auVar101,0xf);
    auVar101 = vpacksswb_avx(auVar101,auVar101);
    uVar74 = (ulong)(byte)(SUB161(auVar101 >> 7,0) & 1 | (SUB161(auVar101 >> 0xf,0) & 1) << 1 |
                           (SUB161(auVar101 >> 0x17,0) & 1) << 2 |
                           (SUB161(auVar101 >> 0x1f,0) & 1) << 3 |
                           (SUB161(auVar101 >> 0x27,0) & 1) << 4 |
                           (SUB161(auVar101 >> 0x2f,0) & 1) << 5 |
                           (SUB161(auVar101 >> 0x37,0) & 1) << 6 | SUB161(auVar101 >> 0x3f,0) << 7);
    auVar180 = ZEXT3264(local_14c0);
    auVar188 = ZEXT3264(local_14e0);
    auVar192 = ZEXT3264(local_1500);
    auVar206 = ZEXT3264(local_1520);
    auVar209 = ZEXT3264(local_1540);
    auVar219 = ZEXT3264(local_1560);
    auVar233 = ZEXT3264(local_1580);
    auVar237 = ZEXT3264(local_15a0);
    auVar240 = ZEXT3264(local_15c0);
    auVar159 = ZEXT3264(local_15e0);
    _local_1830 = auVar68;
    _local_1820 = auVar69;
    _local_1660 = auVar124;
    _local_14a0 = auVar70;
    _local_1490 = auVar71;
    _local_1480 = auVar72;
    _local_1470 = auVar73;
    do {
      uVar78 = 0;
      if (uVar74 != 0) {
        for (; (uVar74 >> uVar78 & 1) == 0; uVar78 = uVar78 + 1) {
        }
      }
      local_17c8 = *(uint *)((long)&local_13e0 + uVar78 * 4);
      pGVar9 = (pSVar89->geometries).items[local_17c8].ptr;
      if ((pGVar9->mask & ray->mask) == 0) {
        uVar74 = uVar74 ^ 1L << (uVar78 & 0x3f);
      }
      else {
        local_1880 = uVar78;
        local_1860 = uVar74;
        pRVar96 = local_1888->args;
        if ((pRVar96->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00e71949;
        local_17b0.context = local_1888->user;
        local_17e0 = *(uint *)(local_1280 + uVar78 * 4);
        auVar101 = ZEXT416(local_17e0);
        local_17dc = *(uint *)(local_1260 + uVar78 * 4);
        auVar112 = ZEXT416(local_17dc);
        local_17d8 = local_1240[uVar78];
        local_17d4 = *(undefined4 *)(local_12e0 + uVar78 * 4);
        local_17d0 = *(undefined4 *)(local_12c0 + uVar78 * 4);
        local_17cc = *(undefined4 *)((long)&local_1400 + uVar78 * 4);
        local_17c4 = (local_17b0.context)->instID[0];
        local_17c0 = (local_17b0.context)->instPrimID[0];
        local_1740._0_4_ = ray->tfar;
        ray->tfar = *(float *)(local_12a0 + uVar78 * 4);
        local_1894 = -1;
        local_17b0.valid = &local_1894;
        local_17b0.geometryUserPtr = pGVar9->userPtr;
        local_17b0.hit = (RTCHitN *)&local_17e0;
        local_17b0.N = 1;
        local_1760._0_8_ = pGVar9;
        local_17b0.ray = (RTCRayN *)ray;
        if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00e717b4:
          if ((pRVar96->filter == (RTCFilterFunctionN)0x0) ||
             (((pRVar96->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
               RTC_RAY_QUERY_FLAG_INCOHERENT && ((*(byte *)(local_1760._0_8_ + 0x3e) & 0x40) == 0)))
             ) {
LAB_00e71949:
            ray->tfar = -INFINITY;
            return;
          }
          auVar126 = ZEXT1664(auVar101);
          auVar139 = ZEXT1664(auVar112);
          (*pRVar96->filter)(&local_17b0);
          auVar116._8_56_ = extraout_var_00;
          auVar116._0_8_ = extraout_XMM1_Qa_00;
          if (*local_17b0.valid != 0) goto LAB_00e71949;
        }
        else {
          local_1780._0_8_ = pRVar96;
          auVar126 = ZEXT464(local_17e0);
          auVar139 = ZEXT464(local_17dc);
          (*pGVar9->occlusionFilterN)(&local_17b0);
          auVar112 = auVar139._0_16_;
          auVar101 = auVar126._0_16_;
          auVar116._8_56_ = extraout_var;
          auVar116._0_8_ = extraout_XMM1_Qa;
          pRVar96 = (RTCIntersectArguments *)local_1780._0_8_;
          if (*local_17b0.valid != 0) goto LAB_00e717b4;
        }
        ray->tfar = (float)local_1740._0_4_;
        uVar74 = local_1860 ^ 1L << (local_1880 & 0x3f);
        auVar180 = ZEXT3264(local_14c0);
        auVar188 = ZEXT3264(local_14e0);
        auVar192 = ZEXT3264(local_1500);
        auVar206 = ZEXT3264(local_1520);
        auVar209 = ZEXT3264(local_1540);
        auVar219 = ZEXT3264(local_1560);
        auVar233 = ZEXT3264(local_1580);
        auVar237 = ZEXT3264(local_15a0);
        auVar240 = ZEXT3264(local_15c0);
        auVar159 = ZEXT3264(local_15e0);
        pSVar89 = local_1890;
      }
    } while (uVar74 != 0);
  }
  lVar82 = lVar82 + 1;
  goto LAB_00e70b65;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }